

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_range_benchmark.c
# Opt level: O0

_Bool naive_intersect(void *base,testvalue_t tv)

{
  _Bool _Var1;
  uint32_t in_stack_0000000c;
  _Bool res;
  roaring_bitmap_t *range;
  roaring_bitmap_t *bm;
  
  roaring_bitmap_from_range((uint64_t)bm,(uint64_t)range,in_stack_0000000c);
  _Var1 = roaring_bitmap_intersect(bm,range);
  roaring_bitmap_free((roaring_bitmap_t *)0x101d1e);
  return _Var1;
}

Assistant:

static bool naive_intersect(void *base, testvalue_t tv) {
    (void)base;
    const roaring_bitmap_t *bm = tv.bitmap;
    roaring_bitmap_t *range =
        roaring_bitmap_from_range(tv.range[0], tv.range[1], 1);
    bool res = roaring_bitmap_intersect(bm, range);
    roaring_bitmap_free(range);
    return res;
}